

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O0

bool __thiscall
irr::scene::CAnimatedMeshSceneNode::removeChild(CAnimatedMeshSceneNode *this,ISceneNode *child)

{
  bool bVar1;
  u32 uVar2;
  IBoneSceneNode **ppIVar3;
  IBoneSceneNode *in_RSI;
  ISceneNode *in_RDI;
  u32 i;
  u32 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  uint local_1c;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = ISceneNode::removeChild
                    ((ISceneNode *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     in_RDI);
  if (bVar1) {
    if (((uint)in_RDI[1].AbsoluteTransformation.M[7] & 1) != 0) {
      local_1c = 0;
      while (uVar4 = local_1c,
            uVar2 = core::array<irr::scene::IBoneSceneNode_*>::size
                              ((array<irr::scene::IBoneSceneNode_*> *)0x2c82aa), uVar4 < uVar2) {
        ppIVar3 = core::array<irr::scene::IBoneSceneNode_*>::operator[]
                            ((array<irr::scene::IBoneSceneNode_*> *)
                             CONCAT44(uVar4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
        if (*ppIVar3 == in_RSI) {
          ppIVar3 = core::array<irr::scene::IBoneSceneNode_*>::operator[]
                              ((array<irr::scene::IBoneSceneNode_*> *)
                               CONCAT44(uVar4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
          *ppIVar3 = (IBoneSceneNode *)0x0;
          break;
        }
        local_1c = local_1c + 1;
      }
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CAnimatedMeshSceneNode::removeChild(ISceneNode *child)
{
	if (ISceneNode::removeChild(child)) {
		if (JointsUsed) { // stop weird bugs caused while changing parents as the joints are being created
			for (u32 i = 0; i < JointChildSceneNodes.size(); ++i) {
				if (JointChildSceneNodes[i] == child) {
					JointChildSceneNodes[i] = 0; // remove link to child
					break;
				}
			}
		}
		return true;
	}

	return false;
}